

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  ushort uVar4;
  undefined8 in_RAX;
  shared_container_t *sc;
  int *piVar5;
  void **ppvVar6;
  int *piVar7;
  long lVar8;
  uint8_t uVar9;
  uint i;
  int iVar10;
  uint uVar11;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar10 = (r->high_low_container).size;
  if ((long)iVar10 == 0) {
LAB_00103d89:
    i = iVar10 - 1;
  }
  else {
    puVar2 = (r->high_low_container).keys;
    uVar4 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar10 + -1] == uVar4) goto LAB_00103d89;
    if (iVar10 < 1) {
      return;
    }
    iVar10 = iVar10 + -1;
    uVar11 = 0;
    do {
      i = iVar10 + uVar11 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar10 + uVar11 & 0xfffffffe));
      if (uVar1 < uVar4) {
        uVar11 = i + 1;
      }
      else {
        if (uVar1 <= uVar4) goto LAB_00103d95;
        iVar10 = i - 1;
      }
    } while ((int)uVar11 <= iVar10);
    i = ~uVar11;
  }
  if ((int)i < 0) {
    return;
  }
LAB_00103d95:
  ppvVar6 = (r->high_low_container).containers;
  puVar3 = (r->high_low_container).typecodes;
  uVar11 = i & 0xffff;
  sc = (shared_container_t *)ppvVar6[uVar11];
  uStack_38 = in_RAX;
  if (puVar3[uVar11] == '\x04') {
    sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
    ppvVar6 = (r->high_low_container).containers;
  }
  *(shared_container_t **)((long)ppvVar6 + (ulong)(uVar11 * 8)) = sc;
  uVar9 = (r->high_low_container).typecodes[uVar11];
  piVar7 = *(int **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
  uStack_38._7_1_ = uVar9;
  piVar5 = (int *)container_remove(piVar7,(uint16_t)val,uVar9,(uint8_t *)((long)&uStack_38 + 7));
  if (piVar5 != piVar7) {
    container_free(piVar7,uVar9);
    (r->high_low_container).containers[i] = piVar5;
    (r->high_low_container).typecodes[i] = uStack_38._7_1_;
  }
  piVar7 = piVar5;
  uVar9 = uStack_38._7_1_;
  if (uStack_38._7_1_ == '\x04') {
    uVar9 = (uint8_t)piVar5[2];
    piVar7 = *(int **)piVar5;
  }
  iVar10 = *piVar7;
  if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
    if (0 < iVar10) {
LAB_00103ebb:
      (r->high_low_container).containers[i] = piVar5;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
      return;
    }
  }
  else if (iVar10 != 0) {
    if (iVar10 != -1) goto LAB_00103ebb;
    lVar8 = 0;
    do {
      if (*(long *)(*(long *)(piVar7 + 2) + lVar8 * 8) != 0) goto LAB_00103ebb;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x400);
  }
  ra_remove_at_index_and_free(&r->high_low_container,i);
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_nonzero_cardinality(container2, newtypecode)) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}